

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_perform(Curl_easy *data)

{
  char *pcVar1;
  uint uVar2;
  bool bVar3;
  CURLMcode CVar4;
  Curl_multi *multi;
  timediff_t tVar5;
  CURLMsg *pCVar6;
  CURLcode CVar7;
  uint uVar8;
  int timeout_ms;
  curltime cVar9;
  curltime cVar10;
  curltime newer;
  CURLcode local_e4;
  int local_e0;
  int still_running;
  ulong local_d8;
  sigpipe_ignore pipe_st;
  
  if (data == (Curl_easy *)0x0) {
    CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    pcVar1 = (data->set).errorbuffer;
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    if (data->multi == (Curl_multi *)0x0) {
      multi = data->multi_easy;
      if (multi == (Curl_multi *)0x0) {
        multi = Curl_multi_handle(1,3);
        if (multi == (Curl_multi *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        data->multi_easy = multi;
      }
      if (multi->in_callback == false) {
        curl_multi_setopt(multi,CURLMOPT_MAXCONNECTS,(data->set).maxconnects);
        CVar4 = curl_multi_add_handle(multi,data);
        if (CVar4 == CURLM_OK) {
          local_d8 = 0;
          sigpipe_ignore(data,&pipe_st);
          data->multi = multi;
          local_e4 = CURLE_OK;
          CVar4 = CURLM_OK;
          do {
            bVar3 = false;
            while( true ) {
              if ((CVar4 != CURLM_OK) || (bVar3)) {
                if (CVar4 != CURLM_OK) {
                  local_e4 = (uint)(CVar4 != CURLM_OUT_OF_MEMORY) * 0x10 + CURLE_OUT_OF_MEMORY;
                }
                curl_multi_remove_handle(multi,data);
                sigpipe_restore(&pipe_st);
                return local_e4;
              }
              still_running = 0;
              cVar9 = Curl_now();
              CVar4 = curl_multi_wait(multi,(curl_waitfd *)0x0,0,1000,&local_e0);
              if (CVar4 == CURLM_OK) {
                uVar8 = 0;
                if (local_e0 == 0) {
                  cVar10 = Curl_now();
                  newer._12_4_ = 0;
                  newer.tv_sec = SUB128(cVar10._0_12_,0);
                  newer.tv_usec = SUB124(cVar10._0_12_,8);
                  cVar10._12_4_ = 0;
                  cVar10.tv_sec = SUB128(cVar9._0_12_,0);
                  cVar10.tv_usec = SUB124(cVar9._0_12_,8);
                  tVar5 = Curl_timediff(newer,cVar10);
                  uVar8 = 0;
                  if (tVar5 < 0xb) {
                    uVar2 = (uint)local_d8;
                    uVar8 = uVar2 + 1;
                    if (1 < (int)uVar2) {
                      timeout_ms = 1 << ((byte)local_d8 & 0x1f);
                      if (8 < uVar2) {
                        timeout_ms = 1000;
                      }
                      Curl_wait_ms(timeout_ms);
                    }
                  }
                }
                CVar4 = curl_multi_perform(multi,&still_running);
                local_d8 = (ulong)uVar8;
              }
              if ((still_running != 0 || CVar4 != CURLM_OK) ||
                 (pCVar6 = curl_multi_info_read(multi,&local_e0), pCVar6 == (CURLMsg *)0x0)) break;
              local_e4 = (pCVar6->data).result;
              bVar3 = true;
            }
          } while( true );
        }
        curl_multi_cleanup(multi);
        CVar7 = CURLE_OUT_OF_MEMORY;
        if (CVar4 != CURLM_OUT_OF_MEMORY) {
          CVar7 = CURLE_FAILED_INIT;
        }
      }
      else {
        CVar7 = CURLE_RECURSIVE_API_CALL;
      }
    }
    else {
      Curl_failf(data,"easy handle already used in multi handle");
      CVar7 = CURLE_FAILED_INIT;
    }
  }
  return CVar7;
}

Assistant:

static CURLcode easy_perform(struct Curl_easy *data, bool events)
{
  struct Curl_multi *multi;
  CURLMcode mcode;
  CURLcode result = CURLE_OK;
  SIGPIPE_VARIABLE(pipe_st);

  if(!data)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(data->set.errorbuffer)
    /* clear this as early as possible */
    data->set.errorbuffer[0] = 0;

  if(data->multi) {
    failf(data, "easy handle already used in multi handle");
    return CURLE_FAILED_INIT;
  }

  if(data->multi_easy)
    multi = data->multi_easy;
  else {
    /* this multi handle will only ever have a single easy handled attached
       to it, so make it use minimal hashes */
    multi = Curl_multi_handle(1, 3);
    if(!multi)
      return CURLE_OUT_OF_MEMORY;
    data->multi_easy = multi;
  }

  if(multi->in_callback)
    return CURLE_RECURSIVE_API_CALL;

  /* Copy the MAXCONNECTS option to the multi handle */
  curl_multi_setopt(multi, CURLMOPT_MAXCONNECTS, data->set.maxconnects);

  mcode = curl_multi_add_handle(multi, data);
  if(mcode) {
    curl_multi_cleanup(multi);
    if(mcode == CURLM_OUT_OF_MEMORY)
      return CURLE_OUT_OF_MEMORY;
    return CURLE_FAILED_INIT;
  }

  sigpipe_ignore(data, &pipe_st);

  /* assign this after curl_multi_add_handle() since that function checks for
     it and rejects this handle otherwise */
  data->multi = multi;

  /* run the transfer */
  result = events ? easy_events(multi) : easy_transfer(multi);

  /* ignoring the return code isn't nice, but atm we can't really handle
     a failure here, room for future improvement! */
  (void)curl_multi_remove_handle(multi, data);

  sigpipe_restore(&pipe_st);

  /* The multi handle is kept alive, owned by the easy handle */
  return result;
}